

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void sftp_packetlist_flush(LIBSSH2_SFTP_HANDLE *handle)

{
  LIBSSH2_SFTP *pLVar1;
  sftp_pipeline_chunk *next;
  int rc;
  size_t data_len;
  uchar *data;
  LIBSSH2_SESSION *session;
  LIBSSH2_SFTP *sftp;
  sftp_pipeline_chunk *chunk;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  session = (LIBSSH2_SESSION *)handle->sftp;
  data = (uchar *)((LIBSSH2_CHANNEL *)session->abstract)->session;
  chunk = (sftp_pipeline_chunk *)handle;
  sftp = (LIBSSH2_SFTP *)_libssh2_list_first(&handle->packet_list);
  while (sftp != (LIBSSH2_SFTP *)0x0) {
    pLVar1 = (LIBSSH2_SFTP *)_libssh2_list_next((list_node *)sftp);
    next._4_4_ = sftp_packet_ask((LIBSSH2_SFTP *)session,'e',
                                 *(uint32_t *)&(sftp->sftp_handles).first,(uchar **)&data_len,
                                 (size_t *)&stack0xffffffffffffffc8);
    if (next._4_4_ != 0) {
      next._4_4_ = sftp_packet_ask((LIBSSH2_SFTP *)session,'g',
                                   *(uint32_t *)&(sftp->sftp_handles).first,(uchar **)&data_len,
                                   (size_t *)&stack0xffffffffffffffc8);
    }
    if (next._4_4_ == 0) {
      (**(code **)(data + 0x18))(data_len,data);
    }
    else if ((sftp->zombie_requests).first != (list_node *)0x0) {
      add_zombie_request((LIBSSH2_SFTP *)session,*(uint32_t *)&(sftp->sftp_handles).first);
    }
    _libssh2_list_remove((list_node *)sftp);
    (**(code **)(data + 0x18))(sftp,data);
    sftp = pLVar1;
  }
  return;
}

Assistant:

static void sftp_packetlist_flush(LIBSSH2_SFTP_HANDLE *handle)
{
    struct sftp_pipeline_chunk *chunk;
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_SESSION *session = sftp->channel->session;

    /* remove pending packets, if any */
    chunk = _libssh2_list_first(&handle->packet_list);
    while(chunk) {
        unsigned char *data;
        size_t data_len;
        int rc;
        struct sftp_pipeline_chunk *next = _libssh2_list_next(&chunk->node);

        rc = sftp_packet_ask(sftp, SSH_FXP_STATUS,
                             chunk->request_id, &data, &data_len);
        if(rc)
            rc = sftp_packet_ask(sftp, SSH_FXP_DATA,
                                 chunk->request_id, &data, &data_len);

        if(!rc)
            /* we found a packet, free it */
            LIBSSH2_FREE(session, data);
        else if(chunk->sent)
            /* there was no incoming packet for this request, mark this
               request as a zombie if it ever sent the request */
            add_zombie_request(sftp, chunk->request_id);

        _libssh2_list_remove(&chunk->node);
        LIBSSH2_FREE(session, chunk);
        chunk = next;
    }
}